

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

int __thiscall doctest::String::copy(String *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  undefined8 uVar1;
  undefined8 uVar2;
  char *__dest;
  void *pvVar3;
  uint uVar4;
  
  if (-1 < (char)dst[0x17]) {
    uVar1 = *(undefined8 *)(dst + 0x10);
    *(undefined8 *)((long)&this->field_0 + 0x10) = uVar1;
    uVar2 = *(undefined8 *)(dst + 8);
    (this->field_0).data.ptr = *(char **)dst;
    *(undefined8 *)((long)&this->field_0 + 8) = uVar2;
    return (int)uVar1;
  }
  (this->field_0).buf[0x17] = -0x80;
  uVar4 = *(uint *)(dst + 8);
  (this->field_0).data.size = uVar4;
  uVar4 = uVar4 + 1;
  (this->field_0).data.capacity = uVar4;
  __dest = (char *)operator_new__((ulong)uVar4);
  (this->field_0).data.ptr = __dest;
  pvVar3 = memcpy(__dest,*(void **)dst,(ulong)uVar4);
  return (int)pvVar3;
}

Assistant:

void String::copy(const String& other) {
    using namespace std;
    if(other.isOnStack()) {
        memcpy(buf, other.buf, len);
    } else {
        setOnHeap();
        data.size     = other.data.size;
        data.capacity = data.size + 1;
        data.ptr      = new char[data.capacity];
        memcpy(data.ptr, other.data.ptr, data.size + 1);
    }
}